

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f Quat4f::lerp(Quat4f *q0,Quat4f *q1,float alpha)

{
  Quat4f *in_RDX;
  Quat4f QVar1;
  
  operator-(in_RDX,q1);
  QVar1 = normalized(q0);
  return (Quat4f)QVar1.m_elements;
}

Assistant:

Quat4f Quat4f::lerp( const Quat4f& q0, const Quat4f& q1, float alpha )
{
	return( ( q0 + alpha * ( q1 - q0 ) ).normalized() );
}